

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVPathRemote.cpp
# Opt level: O3

void adios2::OpenResponseHandler
               (CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  long lVar1;
  
  lVar1 = CMCondition_get_client_data(cm,*vevent);
  *(undefined8 *)(lVar1 + 0x98) = *(undefined8 *)((long)vevent + 8);
  CMCondition_signal(cm,*vevent);
  return;
}

Assistant:

void OpenResponseHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                         attr_list attrs)
{
    EVPathRemoteCommon::OpenResponseMsg open_response_msg =
        static_cast<EVPathRemoteCommon::OpenResponseMsg>(vevent);

    void *obj = CMCondition_get_client_data(cm, open_response_msg->OpenResponseCondition);
    static_cast<EVPathRemote *>(obj)->m_ID = open_response_msg->FileHandle;
    CMCondition_signal(cm, open_response_msg->OpenResponseCondition);
    return;
}